

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFramebufferBlitTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::FramebufferBlitTests::init(FramebufferBlitTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 dVar1;
  deUint32 internalFormat;
  Context *pCVar2;
  long lVar3;
  bool bVar4;
  TextureChannelClass TVar5;
  TextureChannelClass TVar6;
  uint uVar7;
  int iVar8;
  TestNode *pTVar9;
  BlitRectCase *pBVar10;
  long lVar11;
  TestNode *node;
  TextureFormat TVar12;
  char *pcVar13;
  BlitColorConversionCase *this_00;
  BlitDepthStencilCase *pBVar14;
  long extraout_RAX;
  undefined7 extraout_var;
  BlitDefaultFramebufferCase *this_01;
  DefaultFramebufferBlitCase *pDVar15;
  uint srcBuffers;
  long lVar16;
  long lVar17;
  IVec4 *v;
  BlitArea area;
  bool bVar18;
  IVec4 *local_168;
  IVec2 srcSize;
  IVec4 srcSwz_1;
  IVec4 srcSwz;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  TextureFormat local_100;
  IVec4 dstSwz;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  IVec4 dstRect;
  allocator<char> local_aa;
  allocator<char> local_a9;
  long local_a8;
  string name;
  IVec2 dstSize;
  IVec4 srcRect;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (init()::copyRects == '\0') {
    iVar8 = __cxa_guard_acquire(&init()::copyRects);
    if (iVar8 != 0) {
      init::copyRects[0].name = "basic";
      init::copyRects[0].srcRect.m_data[0] = _DAT_009f4110;
      init::copyRects[0].srcRect.m_data[1] = _UNK_009f4114;
      init::copyRects[0].srcRect.m_data[2] = _UNK_009f4118;
      init::copyRects[0].srcRect.m_data[3] = _UNK_009f411c;
      init::copyRects[0].dstRect.m_data[0] = _DAT_009f4120;
      init::copyRects[0].dstRect.m_data[1] = _UNK_009f4124;
      init::copyRects[0].dstRect.m_data[2] = _UNK_009f4128;
      init::copyRects[0].dstRect.m_data[3] = _UNK_009f412c;
      init::copyRects[1].name = "scale";
      init::copyRects[1].srcRect.m_data[0] = _DAT_009f4110;
      init::copyRects[1].srcRect.m_data[1] = _UNK_009f4114;
      init::copyRects[1].srcRect.m_data[2] = _UNK_009f4118;
      init::copyRects[1].srcRect.m_data[3] = _UNK_009f411c;
      init::copyRects[1].dstRect.m_data[0] = _DAT_009f4130;
      init::copyRects[1].dstRect.m_data[1] = _UNK_009f4134;
      init::copyRects[1].dstRect.m_data[2] = _UNK_009f4138;
      init::copyRects[1].dstRect.m_data[3] = _UNK_009f413c;
      init::copyRects[2].name = "out_of_bounds";
      init::copyRects[2].srcRect.m_data[0] = _DAT_009f4140;
      init::copyRects[2].srcRect.m_data[1] = _UNK_009f4144;
      init::copyRects[2].srcRect.m_data[2] = _UNK_009f4148;
      init::copyRects[2].srcRect.m_data[3] = _UNK_009f414c;
      init::copyRects[2].dstRect.m_data[0] = _DAT_009f4150;
      init::copyRects[2].dstRect.m_data[1] = _UNK_009f4154;
      init::copyRects[2].dstRect.m_data[2] = _UNK_009f4158;
      init::copyRects[2].dstRect.m_data[3] = _UNK_009f415c;
      __cxa_guard_release(&init()::copyRects);
    }
  }
  if (init()::filterConsistencyRects == '\0') {
    iVar8 = __cxa_guard_acquire(&init()::filterConsistencyRects);
    if (iVar8 != 0) {
      init::filterConsistencyRects[0].name = "mag";
      init::filterConsistencyRects[0].srcRect.m_data[0] = _DAT_009f4160;
      init::filterConsistencyRects[0].srcRect.m_data[1] = _UNK_009f4164;
      init::filterConsistencyRects[0].srcRect.m_data[2] = _UNK_009f4168;
      init::filterConsistencyRects[0].srcRect.m_data[3] = _UNK_009f416c;
      init::filterConsistencyRects[0].dstRect.m_data[0] = _DAT_009f4170;
      init::filterConsistencyRects[0].dstRect.m_data[1] = _UNK_009f4174;
      init::filterConsistencyRects[0].dstRect.m_data[2] = _UNK_009f4178;
      init::filterConsistencyRects[0].dstRect.m_data[3] = _UNK_009f417c;
      init::filterConsistencyRects[1].name = "min";
      init::filterConsistencyRects[1].srcRect.m_data[0] = _DAT_009f4180;
      init::filterConsistencyRects[1].srcRect.m_data[1] = _UNK_009f4184;
      init::filterConsistencyRects[1].srcRect.m_data[2] = _UNK_009f4188;
      init::filterConsistencyRects[1].srcRect.m_data[3] = _UNK_009f418c;
      init::filterConsistencyRects[1].dstRect.m_data[0] = _DAT_009f4190;
      init::filterConsistencyRects[1].dstRect.m_data[1] = _UNK_009f4194;
      init::filterConsistencyRects[1].dstRect.m_data[2] = _UNK_009f4198;
      init::filterConsistencyRects[1].dstRect.m_data[3] = _UNK_009f419c;
      init::filterConsistencyRects[2].name = "out_of_bounds_mag";
      init::filterConsistencyRects[2].srcRect.m_data[0] = _DAT_009f41a0;
      init::filterConsistencyRects[2].srcRect.m_data[1] = _UNK_009f41a4;
      init::filterConsistencyRects[2].srcRect.m_data[2] = _UNK_009f41a8;
      init::filterConsistencyRects[2].srcRect.m_data[3] = _UNK_009f41ac;
      init::filterConsistencyRects[2].dstRect.m_data[0] = _DAT_009f41b0;
      init::filterConsistencyRects[2].dstRect.m_data[1] = _UNK_009f41b4;
      init::filterConsistencyRects[2].dstRect.m_data[2] = _UNK_009f41b8;
      init::filterConsistencyRects[2].dstRect.m_data[3] = _UNK_009f41bc;
      init::filterConsistencyRects[3].name = "out_of_bounds_min";
      init::filterConsistencyRects[3].srcRect.m_data[0] = _DAT_009f41c0;
      init::filterConsistencyRects[3].srcRect.m_data[1] = _UNK_009f41c4;
      init::filterConsistencyRects[3].srcRect.m_data[2] = _UNK_009f41c8;
      init::filterConsistencyRects[3].srcRect.m_data[3] = _UNK_009f41cc;
      init::filterConsistencyRects[3].dstRect.m_data[0] = _DAT_009f41d0;
      init::filterConsistencyRects[3].dstRect.m_data[1] = _UNK_009f41d4;
      init::filterConsistencyRects[3].dstRect.m_data[2] = _UNK_009f41d8;
      init::filterConsistencyRects[3].dstRect.m_data[3] = _UNK_009f41dc;
      __cxa_guard_release(&init()::filterConsistencyRects);
    }
  }
  if (init()::swizzles == '\0') {
    iVar8 = __cxa_guard_acquire(&init()::swizzles);
    if (iVar8 != 0) {
      init::swizzles[0].name = (char *)0x0;
      init::swizzles[0].srcSwizzle.m_data[0] = _DAT_009b78c0;
      init::swizzles[0].srcSwizzle.m_data[1] = _UNK_009b78c4;
      init::swizzles[0].srcSwizzle.m_data[2] = _UNK_009b78c8;
      init::swizzles[0].srcSwizzle.m_data[3] = _UNK_009b78cc;
      init::swizzles[0].dstSwizzle.m_data[0] = _DAT_009b78c0;
      init::swizzles[0].dstSwizzle.m_data[1] = _UNK_009b78c4;
      init::swizzles[0].dstSwizzle.m_data[2] = _UNK_009b78c8;
      init::swizzles[0].dstSwizzle.m_data[3] = _UNK_009b78cc;
      init::swizzles[1].name = "reverse_src_x";
      init::swizzles[1].srcSwizzle.m_data[0] = _DAT_009f41e0;
      init::swizzles[1].srcSwizzle.m_data[1] = _UNK_009f41e4;
      init::swizzles[1].srcSwizzle.m_data[2] = _UNK_009f41e8;
      init::swizzles[1].srcSwizzle.m_data[3] = _UNK_009f41ec;
      init::swizzles[1].dstSwizzle.m_data[0] = _DAT_009b78c0;
      init::swizzles[1].dstSwizzle.m_data[1] = _UNK_009b78c4;
      init::swizzles[1].dstSwizzle.m_data[2] = _UNK_009b78c8;
      init::swizzles[1].dstSwizzle.m_data[3] = _UNK_009b78cc;
      init::swizzles[2].name = "reverse_src_y";
      init::swizzles[2].srcSwizzle.m_data[0] = _DAT_009f41f0;
      init::swizzles[2].srcSwizzle.m_data[1] = _UNK_009f41f4;
      init::swizzles[2].srcSwizzle.m_data[2] = _UNK_009f41f8;
      init::swizzles[2].srcSwizzle.m_data[3] = _UNK_009f41fc;
      init::swizzles[2].dstSwizzle.m_data[0] = _DAT_009b78c0;
      init::swizzles[2].dstSwizzle.m_data[1] = _UNK_009b78c4;
      init::swizzles[2].dstSwizzle.m_data[2] = _UNK_009b78c8;
      init::swizzles[2].dstSwizzle.m_data[3] = _UNK_009b78cc;
      init::swizzles[3].name = "reverse_dst_x";
      init::swizzles[3].srcSwizzle.m_data[0] = _DAT_009b78c0;
      init::swizzles[3].srcSwizzle.m_data[1] = _UNK_009b78c4;
      init::swizzles[3].srcSwizzle.m_data[2] = _UNK_009b78c8;
      init::swizzles[3].srcSwizzle.m_data[3] = _UNK_009b78cc;
      init::swizzles[3].dstSwizzle.m_data[0] = _DAT_009f41e0;
      init::swizzles[3].dstSwizzle.m_data[1] = _UNK_009f41e4;
      init::swizzles[3].dstSwizzle.m_data[2] = _UNK_009f41e8;
      init::swizzles[3].dstSwizzle.m_data[3] = _UNK_009f41ec;
      init::swizzles[4].name = "reverse_dst_y";
      init::swizzles[4].srcSwizzle.m_data[0] = _DAT_009b78c0;
      init::swizzles[4].srcSwizzle.m_data[1] = _UNK_009b78c4;
      init::swizzles[4].srcSwizzle.m_data[2] = _UNK_009b78c8;
      init::swizzles[4].srcSwizzle.m_data[3] = _UNK_009b78cc;
      init::swizzles[4].dstSwizzle.m_data[0] = _DAT_009f41f0;
      init::swizzles[4].dstSwizzle.m_data[1] = _UNK_009f41f4;
      init::swizzles[4].dstSwizzle.m_data[2] = _UNK_009f41f8;
      init::swizzles[4].dstSwizzle.m_data[3] = _UNK_009f41fc;
      init::swizzles[5].name = "reverse_src_dst_x";
      init::swizzles[5].srcSwizzle.m_data[0] = _DAT_009f41e0;
      init::swizzles[5].srcSwizzle.m_data[1] = _UNK_009f41e4;
      init::swizzles[5].srcSwizzle.m_data[2] = _UNK_009f41e8;
      init::swizzles[5].srcSwizzle.m_data[3] = _UNK_009f41ec;
      init::swizzles[5].dstSwizzle.m_data[0] = _DAT_009f41e0;
      init::swizzles[5].dstSwizzle.m_data[1] = _UNK_009f41e4;
      init::swizzles[5].dstSwizzle.m_data[2] = _UNK_009f41e8;
      init::swizzles[5].dstSwizzle.m_data[3] = _UNK_009f41ec;
      init::swizzles[6].name = "reverse_src_dst_y";
      init::swizzles[6].srcSwizzle.m_data[0] = _DAT_009f41f0;
      init::swizzles[6].srcSwizzle.m_data[1] = _UNK_009f41f4;
      init::swizzles[6].srcSwizzle.m_data[2] = _UNK_009f41f8;
      init::swizzles[6].srcSwizzle.m_data[3] = _UNK_009f41fc;
      init::swizzles[6].dstSwizzle.m_data[0] = _DAT_009f41f0;
      init::swizzles[6].dstSwizzle.m_data[1] = _UNK_009f41f4;
      init::swizzles[6].dstSwizzle.m_data[2] = _UNK_009f41f8;
      init::swizzles[6].dstSwizzle.m_data[3] = _UNK_009f41fc;
      __cxa_guard_release(&init()::swizzles);
    }
  }
  srcSize.m_data[0] = 0x7f;
  srcSize.m_data[1] = 0x77;
  dstSize.m_data[0] = 0x84;
  dstSize.m_data[1] = 0x80;
  pTVar9 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar9,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"rect",
             "Blit rectangle tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar9);
  lVar11 = 0;
  while (lVar11 != 3) {
    lVar16 = lVar11 * 0x28;
    local_168 = &init::swizzles[0].dstSwizzle;
    TVar12.order = RGB;
    TVar12.type = SNORM_INT8;
    local_a8 = lVar11;
    while( true ) {
      if (TVar12 == (TextureFormat)0x0) break;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&srcSwz_1,init::copyRects[lVar11].name,(allocator<char> *)&dstSwz);
      lVar17 = *(long *)((long)(local_168 + -2) + 8);
      local_100 = (TextureFormat)((long)TVar12 + -1);
      if (lVar17 == 0) {
        srcSwz.m_data._0_8_ = &local_118;
        srcSwz.m_data[2] = 0;
        srcSwz.m_data[3] = 0;
        local_118._M_local_buf[0] = '\0';
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"_",&local_a9);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&srcSwz,
                       &local_50,*(char **)((long)(local_168 + -2) + 8));
      }
      std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &srcSwz_1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&srcSwz);
      std::__cxx11::string::~string((string *)&srcSwz);
      if (lVar17 != 0) {
        std::__cxx11::string::~string((string *)&local_50);
      }
      std::__cxx11::string::~string((string *)&srcSwz_1);
      tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&srcSwz,local_168 + -1);
      tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&dstSwz,local_168);
      srcRect.m_data[0] = *(int *)(lVar16 + 0xc5e7c8 + (long)srcSwz.m_data[0] * 4);
      srcRect.m_data[1] = *(int *)(lVar16 + 0xc5e7c8 + (long)srcSwz.m_data[1] * 4);
      srcRect.m_data[2] = *(int *)(lVar16 + 0xc5e7c8 + (long)srcSwz.m_data[2] * 4);
      srcRect.m_data[3] = *(int *)(lVar16 + 0xc5e7c8 + (long)srcSwz.m_data[3] * 4);
      dstRect.m_data[2] = *(int *)(lVar16 + 0xc5e7d8 + (long)dstSwz.m_data[2] * 4);
      dstRect.m_data[3] = *(int *)(lVar16 + 0xc5e7d8 + (long)dstSwz.m_data[3] * 4);
      dstRect.m_data[1] = *(int *)(lVar16 + 0xc5e7d8 + (long)dstSwz.m_data[1] * 4);
      dstRect.m_data[0] = *(int *)(lVar16 + 0xc5e7d8 + (long)dstSwz.m_data[0] * 4);
      pBVar10 = (BlitRectCase *)operator_new(0xe0);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&srcSwz_1,
                     &name,"_nearest");
      BlitRectCase::BlitRectCase
                (pBVar10,pCVar2,(char *)srcSwz_1.m_data._0_8_,"",0x2600,&srcSize,&srcRect,&dstSize,
                 &dstRect,8);
      tcu::TestNode::addChild(pTVar9,(TestNode *)pBVar10);
      std::__cxx11::string::~string((string *)&srcSwz_1);
      pBVar10 = (BlitRectCase *)operator_new(0xe0);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&srcSwz_1,
                     &name,"_linear");
      BlitRectCase::BlitRectCase
                (pBVar10,pCVar2,(char *)srcSwz_1.m_data._0_8_,"",0x2601,&srcSize,&srcRect,&dstSize,
                 &dstRect,8);
      tcu::TestNode::addChild(pTVar9,(TestNode *)pBVar10);
      std::__cxx11::string::~string((string *)&srcSwz_1);
      std::__cxx11::string::~string((string *)&name);
      local_168 = (IVec4 *)((long)(local_168 + 2) + 8);
      TVar12 = local_100;
    }
    lVar11 = local_a8 + 1;
  }
  for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
    lVar17 = lVar11 * 0x28;
    v = &init::swizzles[0].dstSwizzle;
    lVar16 = 7;
    while( true ) {
      bVar18 = lVar16 == 0;
      lVar16 = lVar16 + -1;
      if (bVar18) break;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&srcSwz,"nearest_consistency_",(allocator<char> *)&dstRect);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&srcSwz_1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&srcSwz,
                     init::filterConsistencyRects[lVar11].name);
      lVar3 = *(long *)((long)(v + -2) + 8);
      if (lVar3 == 0) {
        dstSwz.m_data._0_8_ = &local_e8;
        dstSwz.m_data[2] = 0;
        dstSwz.m_data[3] = 0;
        local_e8._M_local_buf[0] = '\0';
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>((string *)&srcRect,"_",&local_aa);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dstSwz,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&srcRect
                       ,*(char **)((long)(v + -2) + 8));
      }
      std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &srcSwz_1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dstSwz);
      std::__cxx11::string::~string((string *)&dstSwz);
      if (lVar3 != 0) {
        std::__cxx11::string::~string((string *)&srcRect);
      }
      std::__cxx11::string::~string((string *)&srcSwz_1);
      std::__cxx11::string::~string((string *)&srcSwz);
      tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&srcSwz_1,v + -1);
      tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&srcSwz,v);
      dstSwz.m_data[1] = *(int *)(lVar17 + 0xc5e848 + (long)srcSwz_1.m_data[1] * 4);
      dstSwz.m_data[0] = *(int *)(lVar17 + 0xc5e848 + (long)srcSwz_1.m_data[0] * 4);
      dstSwz.m_data[3] = *(int *)(lVar17 + 0xc5e848 + (long)srcSwz_1.m_data[3] * 4);
      dstSwz.m_data[2] = *(int *)(lVar17 + 0xc5e848 + (long)srcSwz_1.m_data[2] * 4);
      dstRect.m_data[2] = *(int *)(lVar17 + 0xc5e858 + (long)srcSwz.m_data[2] * 4);
      dstRect.m_data[3] = *(int *)(lVar17 + 0xc5e858 + (long)srcSwz.m_data[3] * 4);
      dstRect.m_data[1] = *(int *)(lVar17 + 0xc5e858 + (long)srcSwz.m_data[1] * 4);
      dstRect.m_data[0] = *(int *)(lVar17 + 0xc5e858 + (long)srcSwz.m_data[0] * 4);
      node = (TestNode *)operator_new(0xe0);
      BlitNearestFilterConsistencyCase::BlitNearestFilterConsistencyCase
                ((BlitNearestFilterConsistencyCase *)node,(this->super_TestCaseGroup).m_context,
                 name._M_dataplus._M_p,"Test consistency of the nearest filter",&srcSize,&dstSwz,
                 &dstSize,&dstRect);
      tcu::TestNode::addChild(pTVar9,node);
      std::__cxx11::string::~string((string *)&name);
      v = (IVec4 *)((long)(v + 2) + 8);
    }
  }
  pTVar9 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar9,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"conversion",
             "Color conversion tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar9);
  for (lVar11 = 0; lVar11 != 0x23; lVar11 = lVar11 + 1) {
    dVar1 = init::colorFormats[lVar11];
    for (lVar16 = 0; lVar16 != 0x8c; lVar16 = lVar16 + 4) {
      TVar12 = glu::mapGLInternalFormat(dVar1);
      TVar5 = tcu::getTextureChannelClass(TVar12.type);
      internalFormat = *(deUint32 *)((long)init::colorFormats + lVar16);
      TVar12 = glu::mapGLInternalFormat(internalFormat);
      TVar6 = tcu::getTextureChannelClass(TVar12.type);
      if ((((TVar5 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT ||
            TVar5 == TEXTURECHANNELCLASS_FLOATING_POINT) !=
            (TVar6 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT &&
            TVar6 != TEXTURECHANNELCLASS_FLOATING_POINT)) &&
          ((TVar5 == TEXTURECHANNELCLASS_SIGNED_INTEGER) !=
           (TVar6 != TEXTURECHANNELCLASS_SIGNED_INTEGER))) &&
         ((TVar5 == TEXTURECHANNELCLASS_UNSIGNED_INTEGER) !=
          (TVar6 != TEXTURECHANNELCLASS_UNSIGNED_INTEGER))) {
        pcVar13 = FboTestUtil::getFormatName(dVar1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&srcSwz,pcVar13,(allocator<char> *)&dstSwz);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &srcSwz_1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&srcSwz,
                       "_to_");
        pcVar13 = FboTestUtil::getFormatName(internalFormat);
        std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &srcSwz_1,pcVar13);
        std::__cxx11::string::~string((string *)&srcSwz_1);
        std::__cxx11::string::~string((string *)&srcSwz);
        this_00 = (BlitColorConversionCase *)operator_new(0x98);
        srcSwz_1.m_data[0] = 0x7f;
        srcSwz_1.m_data[1] = 0x71;
        BlitColorConversionCase::BlitColorConversionCase
                  (this_00,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p,"",dVar1,
                   internalFormat,(IVec2 *)&srcSwz_1);
        tcu::TestNode::addChild(pTVar9,(TestNode *)this_00);
        std::__cxx11::string::~string((string *)&name);
      }
    }
  }
  pTVar9 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar9,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "depth_stencil","Depth and stencil blits");
  tcu::TestNode::addChild((TestNode *)this,pTVar9);
  lVar11 = 0;
  while (lVar11 != 0x18) {
    dVar1 = *(deUint32 *)((long)init::depthStencilFormats + lVar11);
    local_a8 = lVar11;
    TVar12 = glu::mapGLInternalFormat(dVar1);
    pcVar13 = FboTestUtil::getFormatName(dVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,pcVar13,(allocator<char> *)&srcSwz_1);
    uVar7 = TVar12.order - S;
    local_100 = TVar12;
    pBVar14 = (BlitDepthStencilCase *)operator_new(200);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&srcSwz_1,
                   &name,"_basic");
    srcBuffers = (uint)(uVar7 < 2) << 10 | (uint)((TVar12.order - D & 0xfffffffd) == 0) << 8;
    dstRect.m_data[0] = 0x80;
    dstRect.m_data[1] = 0x80;
    srcSwz.m_data[0] = 0;
    srcSwz.m_data[1] = 0;
    srcSwz.m_data[2] = 0x80;
    srcSwz.m_data[3] = 0x80;
    srcSize.m_data[0] = 0x80;
    srcSize.m_data[1] = 0x80;
    dstSwz.m_data[0] = 0;
    dstSwz.m_data[1] = 0;
    dstSwz.m_data[2] = 0x80;
    dstSwz.m_data[3] = 0x80;
    BlitDepthStencilCase::BlitDepthStencilCase
              (pBVar14,pCVar2,(char *)srcSwz_1.m_data._0_8_,"",dVar1,srcBuffers,(IVec2 *)&dstRect,
               &srcSwz,srcBuffers,&srcSize,&dstSwz,srcBuffers);
    tcu::TestNode::addChild(pTVar9,(TestNode *)pBVar14);
    std::__cxx11::string::~string((string *)&srcSwz_1);
    pBVar14 = (BlitDepthStencilCase *)operator_new(200);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&srcSwz_1,
                   &name,"_scale");
    dstRect.m_data[0] = 0x7f;
    dstRect.m_data[1] = 0x77;
    srcSwz.m_data[0] = 10;
    srcSwz.m_data[1] = 0x1e;
    srcSwz.m_data[2] = 100;
    srcSwz.m_data[3] = 0x46;
    srcSize.m_data[0] = 0x6f;
    srcSize.m_data[1] = 0x82;
    dstSwz.m_data[0] = 0x14;
    dstSwz.m_data[1] = 5;
    dstSwz.m_data[2] = 0x50;
    dstSwz.m_data[3] = 0x82;
    BlitDepthStencilCase::BlitDepthStencilCase
              (pBVar14,pCVar2,(char *)srcSwz_1.m_data._0_8_,"",dVar1,srcBuffers,(IVec2 *)&dstRect,
               &srcSwz,srcBuffers,&srcSize,&dstSwz,srcBuffers);
    tcu::TestNode::addChild(pTVar9,(TestNode *)pBVar14);
    std::__cxx11::string::~string((string *)&srcSwz_1);
    if (((local_100.order == DS) || (local_100.order == D)) && (uVar7 < 2)) {
      pBVar14 = (BlitDepthStencilCase *)operator_new(200);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&srcSwz_1,
                     &name,"_depth_only");
      dstRect.m_data[0] = 0x80;
      dstRect.m_data[1] = 0x80;
      srcSwz.m_data[0] = 0;
      srcSwz.m_data[1] = 0;
      srcSwz.m_data[2] = 0x80;
      srcSwz.m_data[3] = 0x80;
      srcSize.m_data[0] = 0x80;
      srcSize.m_data[1] = 0x80;
      dstSwz.m_data[0] = 0;
      dstSwz.m_data[1] = 0;
      dstSwz.m_data[2] = 0x80;
      dstSwz.m_data[3] = 0x80;
      BlitDepthStencilCase::BlitDepthStencilCase
                (pBVar14,pCVar2,(char *)srcSwz_1.m_data._0_8_,"",dVar1,srcBuffers,(IVec2 *)&dstRect,
                 &srcSwz,srcBuffers,&srcSize,&dstSwz,0x100);
      tcu::TestNode::addChild(pTVar9,(TestNode *)pBVar14);
      std::__cxx11::string::~string((string *)&srcSwz_1);
      pBVar14 = (BlitDepthStencilCase *)operator_new(200);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&srcSwz_1,
                     &name,"_stencil_only");
      dstRect.m_data[0] = 0x80;
      dstRect.m_data[1] = 0x80;
      srcSwz.m_data[0] = 0;
      srcSwz.m_data[1] = 0;
      srcSwz.m_data[2] = 0x80;
      srcSwz.m_data[3] = 0x80;
      srcSize.m_data[0] = 0x80;
      srcSize.m_data[1] = 0x80;
      dstSwz.m_data[0] = 0;
      dstSwz.m_data[1] = 0;
      dstSwz.m_data[2] = 0x80;
      dstSwz.m_data[3] = 0x80;
      BlitDepthStencilCase::BlitDepthStencilCase
                (pBVar14,pCVar2,(char *)srcSwz_1.m_data._0_8_,"",dVar1,srcBuffers,(IVec2 *)&dstRect,
                 &srcSwz,srcBuffers,&srcSize,&dstSwz,0x400);
      tcu::TestNode::addChild(pTVar9,(TestNode *)pBVar14);
      std::__cxx11::string::~string((string *)&srcSwz_1);
    }
    std::__cxx11::string::~string((string *)&name);
    lVar11 = local_a8 + 4;
  }
  pTVar9 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar9,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "default_framebuffer","Blits with default framebuffer");
  tcu::TestNode::addChild((TestNode *)this,pTVar9);
  lVar16 = 0;
  lVar11 = extraout_RAX;
  local_100 = (TextureFormat)pTVar9;
  do {
    if (lVar16 == 0x23) {
      return (int)lVar11;
    }
    dVar1 = init::colorFormats[lVar16];
    TVar12 = glu::mapGLInternalFormat(dVar1);
    TVar5 = tcu::getTextureChannelClass(TVar12.type);
    bVar18 = glu::isGLInternalColorFormatFilterable(dVar1);
    bVar4 = glu::isGLInternalColorFormatFilterable(dVar1);
    lVar11 = CONCAT71(extraout_var,bVar4);
    local_a8 = CONCAT71(local_a8._1_7_,bVar4);
    if (TVar5 < TEXTURECHANNELCLASS_LAST) {
      lVar11 = 0x13;
      if ((0x13U >> (TVar5 & 0x1f) & 1) != 0) {
        this_01 = (BlitDefaultFramebufferCase *)operator_new(0x90);
        pCVar2 = (this->super_TestCaseGroup).m_context;
        pcVar13 = FboTestUtil::getFormatName(dVar1);
        BlitDefaultFramebufferCase::BlitDefaultFramebufferCase
                  (this_01,pCVar2,pcVar13,"",dVar1,bVar18 | 0x2600);
        tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)this_01);
        for (lVar11 = 0; lVar11 != 0x20; lVar11 = lVar11 + 0x10) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&name,*(char **)((long)&init::areas[0].name + lVar11),
                     (allocator<char> *)&srcSwz_1);
          if ((char)local_a8 == '\0') {
LAB_006a9a31:
            pDVar15 = (DefaultFramebufferBlitCase *)operator_new(200);
            pCVar2 = (this->super_TestCaseGroup).m_context;
            pcVar13 = FboTestUtil::getFormatName(dVar1);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&dstRect,pcVar13,(allocator<char> *)&srcSize);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &dstSwz,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&dstRect,"_nearest_");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &srcSwz,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&dstSwz,&name);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &srcSwz_1,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &srcSwz,"_blit_from_default");
            area = *(BlitArea *)((long)&init::areas[0].area + lVar11);
            DefaultFramebufferBlitCase::DefaultFramebufferBlitCase
                      (pDVar15,pCVar2,(char *)srcSwz_1.m_data._0_8_,"",dVar1,0x2600,
                       BLIT_DEFAULT_TO_TARGET,area);
            tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)pDVar15);
            std::__cxx11::string::~string((string *)&srcSwz_1);
            std::__cxx11::string::~string((string *)&srcSwz);
            std::__cxx11::string::~string((string *)&dstSwz);
            std::__cxx11::string::~string((string *)&dstRect);
            pDVar15 = (DefaultFramebufferBlitCase *)operator_new(200);
            pCVar2 = (this->super_TestCaseGroup).m_context;
            pcVar13 = FboTestUtil::getFormatName(dVar1);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&dstRect,pcVar13,(allocator<char> *)&srcSize);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &dstSwz,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&dstRect,"_nearest_");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &srcSwz,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&dstSwz,&name);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &srcSwz_1,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &srcSwz,"_blit_to_default");
            DefaultFramebufferBlitCase::DefaultFramebufferBlitCase
                      (pDVar15,pCVar2,(char *)srcSwz_1.m_data._0_8_,"",dVar1,0x2600,
                       BLIT_TO_DEFAULT_FROM_TARGET,area);
            tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)pDVar15);
            std::__cxx11::string::~string((string *)&srcSwz_1);
            std::__cxx11::string::~string((string *)&srcSwz);
            std::__cxx11::string::~string((string *)&dstSwz);
            std::__cxx11::string::~string((string *)&dstRect);
            if ((char)local_a8 != '\0') goto LAB_006a9c0a;
          }
          else {
            area = AREA_OUT_OF_BOUNDS;
            if (*(int *)((long)&init::areas[0].area + lVar11) != 1) goto LAB_006a9a31;
LAB_006a9c0a:
            pDVar15 = (DefaultFramebufferBlitCase *)operator_new(200);
            pCVar2 = (this->super_TestCaseGroup).m_context;
            pcVar13 = FboTestUtil::getFormatName(dVar1);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&dstRect,pcVar13,(allocator<char> *)&srcSize);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &dstSwz,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&dstRect,"_linear_");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &srcSwz,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&dstSwz,&name);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &srcSwz_1,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &srcSwz,"_blit_from_default");
            DefaultFramebufferBlitCase::DefaultFramebufferBlitCase
                      (pDVar15,pCVar2,(char *)srcSwz_1.m_data._0_8_,"",dVar1,0x2601,
                       BLIT_DEFAULT_TO_TARGET,area);
            tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)pDVar15);
            std::__cxx11::string::~string((string *)&srcSwz_1);
            std::__cxx11::string::~string((string *)&srcSwz);
            std::__cxx11::string::~string((string *)&dstSwz);
            std::__cxx11::string::~string((string *)&dstRect);
            pDVar15 = (DefaultFramebufferBlitCase *)operator_new(200);
            pCVar2 = (this->super_TestCaseGroup).m_context;
            pcVar13 = FboTestUtil::getFormatName(dVar1);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&dstRect,pcVar13,(allocator<char> *)&srcSize);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &dstSwz,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&dstRect,"_linear_");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &srcSwz,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&dstSwz,&name);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &srcSwz_1,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &srcSwz,"_blit_to_default");
            DefaultFramebufferBlitCase::DefaultFramebufferBlitCase
                      (pDVar15,pCVar2,(char *)srcSwz_1.m_data._0_8_,"",dVar1,0x2601,
                       BLIT_TO_DEFAULT_FROM_TARGET,area);
            tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)pDVar15);
            std::__cxx11::string::~string((string *)&srcSwz_1);
            std::__cxx11::string::~string((string *)&srcSwz);
            std::__cxx11::string::~string((string *)&dstSwz);
            std::__cxx11::string::~string((string *)&dstRect);
          }
          std::__cxx11::string::~string((string *)&name);
        }
      }
    }
    lVar16 = lVar16 + 1;
  } while( true );
}

Assistant:

void FramebufferBlitTests::init (void)
{
	static const deUint32 colorFormats[] =
	{
		// RGBA formats
		GL_RGBA32I,
		GL_RGBA32UI,
		GL_RGBA16I,
		GL_RGBA16UI,
		GL_RGBA8,
		GL_RGBA8I,
		GL_RGBA8UI,
		GL_SRGB8_ALPHA8,
		GL_RGB10_A2,
		GL_RGB10_A2UI,
		GL_RGBA4,
		GL_RGB5_A1,

		// RGB formats
		GL_RGB8,
		GL_RGB565,

		// RG formats
		GL_RG32I,
		GL_RG32UI,
		GL_RG16I,
		GL_RG16UI,
		GL_RG8,
		GL_RG8I,
		GL_RG8UI,

		// R formats
		GL_R32I,
		GL_R32UI,
		GL_R16I,
		GL_R16UI,
		GL_R8,
		GL_R8I,
		GL_R8UI,

		// GL_EXT_color_buffer_float
		GL_RGBA32F,
		GL_RGBA16F,
		GL_R11F_G11F_B10F,
		GL_RG32F,
		GL_RG16F,
		GL_R32F,
		GL_R16F
	};

	static const deUint32 depthStencilFormats[] =
	{
		GL_DEPTH_COMPONENT32F,
		GL_DEPTH_COMPONENT24,
		GL_DEPTH_COMPONENT16,
		GL_DEPTH32F_STENCIL8,
		GL_DEPTH24_STENCIL8,
		GL_STENCIL_INDEX8
	};

	// .rect
	{
		static const struct
		{
			const char*	name;
			IVec4		srcRect;
			IVec4		dstRect;
		} copyRects[] =
		{
			{ "basic",						IVec4( 10,  20,  65, 100),		IVec4( 45,   5, 100,  85) },
			{ "scale",						IVec4( 10,  20,  65, 100),		IVec4( 25,  30, 125,  94) },
			{ "out_of_bounds",				IVec4(-10, -15, 100,  63),		IVec4( 50,  30, 136, 144) },
		};

		static const struct
		{
			const char*	name;
			IVec4		srcRect;
			IVec4		dstRect;
		} filterConsistencyRects[] =
		{
			{ "mag",						IVec4( 20,  10,  74, 88),		IVec4( 10,  10,  91, 101) },
			{ "min",						IVec4( 10,  20,  78, 100),		IVec4( 20,  20,  71,  80) },
			{ "out_of_bounds_mag",			IVec4( 21,  10,  73, 82),		IVec4( 11,  43, 141, 151) },
			{ "out_of_bounds_min",			IVec4( 11,  21,  77, 97),		IVec4( 80,  82, 135, 139) },
		};

		static const struct
		{
			const char* name;
			IVec4		srcSwizzle;
			IVec4		dstSwizzle;
		} swizzles[] =
		{
			{ DE_NULL,				IVec4(0,1,2,3),	IVec4(0,1,2,3) },
			{ "reverse_src_x",		IVec4(2,1,0,3), IVec4(0,1,2,3) },
			{ "reverse_src_y",		IVec4(0,3,2,1), IVec4(0,1,2,3) },
			{ "reverse_dst_x",		IVec4(0,1,2,3), IVec4(2,1,0,3) },
			{ "reverse_dst_y",		IVec4(0,1,2,3), IVec4(0,3,2,1) },
			{ "reverse_src_dst_x",	IVec4(2,1,0,3), IVec4(2,1,0,3) },
			{ "reverse_src_dst_y",	IVec4(0,3,2,1), IVec4(0,3,2,1) }
		};

		const IVec2 srcSize(127, 119);
		const IVec2 dstSize(132, 128);

		// Blit rectangle tests.
		tcu::TestCaseGroup* rectGroup = new tcu::TestCaseGroup(m_testCtx, "rect", "Blit rectangle tests");
		addChild(rectGroup);
		for (int rectNdx = 0; rectNdx < DE_LENGTH_OF_ARRAY(copyRects); rectNdx++)
		{
			for (int swzNdx = 0; swzNdx < DE_LENGTH_OF_ARRAY(swizzles); swzNdx++)
			{
				string		name	= string(copyRects[rectNdx].name) + (swizzles[swzNdx].name ? (string("_") + swizzles[swzNdx].name) : string());
				IVec4		srcSwz	= swizzles[swzNdx].srcSwizzle;
				IVec4		dstSwz	= swizzles[swzNdx].dstSwizzle;
				IVec4		srcRect	= copyRects[rectNdx].srcRect.swizzle(srcSwz[0], srcSwz[1], srcSwz[2], srcSwz[3]);
				IVec4		dstRect	= copyRects[rectNdx].dstRect.swizzle(dstSwz[0], dstSwz[1], dstSwz[2], dstSwz[3]);

				rectGroup->addChild(new BlitRectCase(m_context, (name + "_nearest").c_str(),	"", GL_NEAREST,	srcSize, srcRect, dstSize, dstRect));
				rectGroup->addChild(new BlitRectCase(m_context, (name + "_linear").c_str(),		"", GL_LINEAR,	srcSize, srcRect, dstSize, dstRect));
			}
		}

		// Nearest filter tests
		for (int rectNdx = 0; rectNdx < DE_LENGTH_OF_ARRAY(filterConsistencyRects); rectNdx++)
		{
			for (int swzNdx = 0; swzNdx < DE_LENGTH_OF_ARRAY(swizzles); swzNdx++)
			{
				string		name	= string("nearest_consistency_") + filterConsistencyRects[rectNdx].name + (swizzles[swzNdx].name ? (string("_") + swizzles[swzNdx].name) : string());
				IVec4		srcSwz	= swizzles[swzNdx].srcSwizzle;
				IVec4		dstSwz	= swizzles[swzNdx].dstSwizzle;
				IVec4		srcRect	= filterConsistencyRects[rectNdx].srcRect.swizzle(srcSwz[0], srcSwz[1], srcSwz[2], srcSwz[3]);
				IVec4		dstRect	= filterConsistencyRects[rectNdx].dstRect.swizzle(dstSwz[0], dstSwz[1], dstSwz[2], dstSwz[3]);

				rectGroup->addChild(new BlitNearestFilterConsistencyCase(m_context, name.c_str(), "Test consistency of the nearest filter", srcSize, srcRect, dstSize, dstRect));
			}
		}
	}

	// .conversion
	{
		tcu::TestCaseGroup* conversionGroup = new tcu::TestCaseGroup(m_testCtx, "conversion", "Color conversion tests");
		addChild(conversionGroup);

		for (int srcFmtNdx = 0; srcFmtNdx < DE_LENGTH_OF_ARRAY(colorFormats); srcFmtNdx++)
		{
			for (int dstFmtNdx = 0; dstFmtNdx < DE_LENGTH_OF_ARRAY(colorFormats); dstFmtNdx++)
			{
				deUint32					srcFormat	= colorFormats[srcFmtNdx];
				tcu::TextureFormat			srcTexFmt	= glu::mapGLInternalFormat(srcFormat);
				tcu::TextureChannelClass	srcType		= tcu::getTextureChannelClass(srcTexFmt.type);
				deUint32					dstFormat	= colorFormats[dstFmtNdx];
				tcu::TextureFormat			dstTexFmt	= glu::mapGLInternalFormat(dstFormat);
				tcu::TextureChannelClass	dstType		= tcu::getTextureChannelClass(dstTexFmt.type);

				if (((srcType == tcu::TEXTURECHANNELCLASS_FLOATING_POINT || srcType == tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) !=
					 (dstType == tcu::TEXTURECHANNELCLASS_FLOATING_POINT || dstType == tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT)) ||
					((srcType == tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER) != (dstType == tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER)) ||
					((srcType == tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER) != (dstType == tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER)))
					continue; // Conversion not supported.

				string						name		= string(getFormatName(srcFormat)) + "_to_" + getFormatName(dstFormat);

				conversionGroup->addChild(new BlitColorConversionCase(m_context, name.c_str(), "", srcFormat, dstFormat, IVec2(127, 113)));
			}
		}
	}

	// .depth_stencil
	{
		tcu::TestCaseGroup* depthStencilGroup = new tcu::TestCaseGroup(m_testCtx, "depth_stencil", "Depth and stencil blits");
		addChild(depthStencilGroup);

		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(depthStencilFormats); fmtNdx++)
		{
			deUint32			format		= depthStencilFormats[fmtNdx];
			tcu::TextureFormat	texFmt		= glu::mapGLInternalFormat(format);
			string				fmtName		= getFormatName(format);
			bool				depth		= texFmt.order == tcu::TextureFormat::D || texFmt.order == tcu::TextureFormat::DS;
			bool				stencil		= texFmt.order == tcu::TextureFormat::S || texFmt.order == tcu::TextureFormat::DS;
			deUint32			buffers		= (depth ? GL_DEPTH_BUFFER_BIT : 0) | (stencil ? GL_STENCIL_BUFFER_BIT : 0);

			depthStencilGroup->addChild(new BlitDepthStencilCase(m_context, (fmtName + "_basic").c_str(), "", format, buffers, IVec2(128, 128), IVec4(0, 0, 128, 128), buffers, IVec2(128, 128), IVec4(0, 0, 128, 128), buffers));
			depthStencilGroup->addChild(new BlitDepthStencilCase(m_context, (fmtName + "_scale").c_str(), "", format, buffers, IVec2(127, 119), IVec4(10, 30, 100, 70), buffers, IVec2(111, 130), IVec4(20, 5, 80, 130), buffers));

			if (depth && stencil)
			{
				depthStencilGroup->addChild(new BlitDepthStencilCase(m_context, (fmtName + "_depth_only").c_str(),		"", format, buffers, IVec2(128, 128), IVec4(0, 0, 128, 128), buffers, IVec2(128, 128), IVec4(0, 0, 128, 128), GL_DEPTH_BUFFER_BIT));
				depthStencilGroup->addChild(new BlitDepthStencilCase(m_context, (fmtName + "_stencil_only").c_str(),	"", format, buffers, IVec2(128, 128), IVec4(0, 0, 128, 128), buffers, IVec2(128, 128), IVec4(0, 0, 128, 128), GL_STENCIL_BUFFER_BIT));
			}
		}
	}

	// .default_framebuffer
	{
		static const struct
		{
			const char*								name;
			DefaultFramebufferBlitCase::BlitArea	area;
		} areas[] =
		{
			{ "scale",						DefaultFramebufferBlitCase::AREA_SCALE			},
			{ "out_of_bounds",				DefaultFramebufferBlitCase::AREA_OUT_OF_BOUNDS	},
		};

		tcu::TestCaseGroup* defaultFbGroup = new tcu::TestCaseGroup(m_testCtx, "default_framebuffer", "Blits with default framebuffer");
		addChild(defaultFbGroup);

		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(colorFormats); fmtNdx++)
		{
			const deUint32					format		= colorFormats[fmtNdx];
			const tcu::TextureFormat		texFmt		= glu::mapGLInternalFormat(format);
			const tcu::TextureChannelClass	fmtClass	= tcu::getTextureChannelClass(texFmt.type);
			const deUint32					filter		= glu::isGLInternalColorFormatFilterable(format) ? GL_LINEAR : GL_NEAREST;
			const bool						filterable	= glu::isGLInternalColorFormatFilterable(format);

			if (fmtClass != tcu::TEXTURECHANNELCLASS_FLOATING_POINT &&
				fmtClass != tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT &&
				fmtClass != tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT)
				continue; // Conversion not supported.

			defaultFbGroup->addChild(new BlitDefaultFramebufferCase(m_context, getFormatName(format), "", format, filter));

			for (int areaNdx = 0; areaNdx < DE_LENGTH_OF_ARRAY(areas); areaNdx++)
			{
				const string	name				= string(areas[areaNdx].name);
				const bool		addLinear			= filterable;
				const bool		addNearest			= !addLinear || (areas[areaNdx].area != DefaultFramebufferBlitCase::AREA_OUT_OF_BOUNDS); // No need to check out-of-bounds with different filtering

				if (addNearest)
				{
					defaultFbGroup->addChild(new DefaultFramebufferBlitCase(m_context, (std::string(getFormatName(format)) + "_nearest_" + name + "_blit_from_default").c_str(), "", format, GL_NEAREST, DefaultFramebufferBlitCase::BLIT_DEFAULT_TO_TARGET, areas[areaNdx].area));
					defaultFbGroup->addChild(new DefaultFramebufferBlitCase(m_context, (std::string(getFormatName(format)) + "_nearest_" + name + "_blit_to_default").c_str(), "", format, GL_NEAREST, DefaultFramebufferBlitCase::BLIT_TO_DEFAULT_FROM_TARGET, areas[areaNdx].area));
				}

				if (addLinear)
				{
					defaultFbGroup->addChild(new DefaultFramebufferBlitCase(m_context, (std::string(getFormatName(format)) + "_linear_" + name + "_blit_from_default").c_str(), "", format, GL_LINEAR, DefaultFramebufferBlitCase::BLIT_DEFAULT_TO_TARGET, areas[areaNdx].area));
					defaultFbGroup->addChild(new DefaultFramebufferBlitCase(m_context, (std::string(getFormatName(format)) + "_linear_" + name + "_blit_to_default").c_str(), "", format, GL_LINEAR, DefaultFramebufferBlitCase::BLIT_TO_DEFAULT_FROM_TARGET, areas[areaNdx].area));
				}
			}
		}
	}
}